

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffobjs.c
# Opt level: O1

FT_Error cff_size_select(FT_Size size,FT_ULong strike_index)

{
  long lVar1;
  undefined8 *puVar2;
  long b_;
  long c_;
  PSH_Globals_Funcs pPVar3;
  FT_Long a_;
  FT_Fixed FVar4;
  ulong uVar5;
  
  size[1].face = (FT_Face)strike_index;
  FT_Select_Metrics(size->face,strike_index);
  pPVar3 = cff_size_get_globals_funcs((CFF_Size)size);
  if (pPVar3 != (PSH_Globals_Funcs)0x0) {
    lVar1 = size->face[4].bbox.yMin;
    puVar2 = (undefined8 *)size->internal->module_data;
    b_ = *(long *)(lVar1 + 0x6d0);
    (*pPVar3->set_scale)((PSH_Globals)*puVar2,(size->metrics).x_scale,(size->metrics).y_scale,0,0);
    for (uVar5 = (ulong)*(uint *)(lVar1 + 0xb30); uVar5 != 0; uVar5 = uVar5 - 1) {
      c_ = *(long *)(*(long *)(lVar1 + 0xb30 + uVar5 * 8) + 0x68);
      a_ = (size->metrics).x_scale;
      if (b_ == c_) {
        FVar4 = (size->metrics).y_scale;
      }
      else {
        a_ = FT_MulDiv(a_,b_,c_);
        FVar4 = FT_MulDiv((size->metrics).y_scale,b_,c_);
      }
      (*pPVar3->set_scale)((PSH_Globals)puVar2[uVar5],a_,FVar4,0,0);
    }
  }
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cff_size_select( FT_Size   size,
                   FT_ULong  strike_index )
  {
    CFF_Size           cffsize = (CFF_Size)size;
    PSH_Globals_Funcs  funcs;


    cffsize->strike_index = strike_index;

    FT_Select_Metrics( size->face, strike_index );

    funcs = cff_size_get_globals_funcs( cffsize );

    if ( funcs )
    {
      CFF_Face      face     = (CFF_Face)size->face;
      CFF_Font      font     = (CFF_Font)face->extra.data;
      CFF_Internal  internal = (CFF_Internal)size->internal->module_data;

      FT_Long  top_upm  = (FT_Long)font->top_font.font_dict.units_per_em;
      FT_UInt  i;


      funcs->set_scale( internal->topfont,
                        size->metrics.x_scale, size->metrics.y_scale,
                        0, 0 );

      for ( i = font->num_subfonts; i > 0; i-- )
      {
        CFF_SubFont  sub     = font->subfonts[i - 1];
        FT_Long      sub_upm = (FT_Long)sub->font_dict.units_per_em;
        FT_Pos       x_scale, y_scale;


        if ( top_upm != sub_upm )
        {
          x_scale = FT_MulDiv( size->metrics.x_scale, top_upm, sub_upm );
          y_scale = FT_MulDiv( size->metrics.y_scale, top_upm, sub_upm );
        }
        else
        {
          x_scale = size->metrics.x_scale;
          y_scale = size->metrics.y_scale;
        }

        funcs->set_scale( internal->subfonts[i - 1],
                          x_scale, y_scale, 0, 0 );
      }
    }

    return FT_Err_Ok;
  }